

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void update_zeromv_cnt(AV1_COMP *cpi,MB_MODE_INFO *mi,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  int map_offset;
  int x;
  int y;
  int block_index;
  int ymis;
  int xmis;
  int bh;
  int bw;
  MV mv;
  AV1_COMMON *cm;
  int local_54;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  short local_2c;
  short sStack_2a;
  
  if (((*(char *)(in_RSI + 0x10) == '\x01') &&
      (iVar3 = is_inter_block((MB_MODE_INFO *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
      iVar3 != 0)) && (((byte)*(undefined2 *)(in_RSI + 0xa7) & 7) < 3)) {
    uVar1 = *(undefined4 *)(in_RSI + 8);
    iVar3 = (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [in_R8B] >> 1;
    local_54 = (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [in_R8B] >> 1;
    if (*(int *)(in_RDI + 0x3c198) - in_ECX >> 1 < iVar3) {
      iVar3 = *(int *)(in_RDI + 0x3c198) - in_ECX >> 1;
    }
    if (*(int *)(in_RDI + 0x3c194) - in_EDX >> 1 < local_54) {
      local_54 = *(int *)(in_RDI + 0x3c194) - in_EDX >> 1;
    }
    iVar2 = *(int *)(in_RDI + 0x3c198);
    for (local_44 = 0; local_44 < local_54; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
        iVar4 = (in_EDX >> 1) * (iVar2 >> 1) + (in_ECX >> 1) +
                local_44 * (*(int *)(in_RDI + 0x3c198) >> 1) + local_48;
        local_2c = (short)uVar1;
        iVar5 = (int)local_2c;
        if (iVar5 < 1) {
          iVar5 = -iVar5;
        }
        if (iVar5 < 10) {
          sStack_2a = (short)((uint)uVar1 >> 0x10);
          iVar5 = (int)sStack_2a;
          if (iVar5 < 1) {
            iVar5 = -iVar5;
          }
          if (9 < iVar5) goto LAB_00294c09;
          if (*(char *)(*(long *)(in_RDI + 0x9d508) + (long)iVar4) != -1) {
            *(char *)(*(long *)(in_RDI + 0x9d508) + (long)iVar4) =
                 *(char *)(*(long *)(in_RDI + 0x9d508) + (long)iVar4) + '\x01';
          }
        }
        else {
LAB_00294c09:
          *(undefined1 *)(*(long *)(in_RDI + 0x9d508) + (long)iVar4) = 0;
        }
      }
    }
  }
  return;
}

Assistant:

static void update_zeromv_cnt(const AV1_COMP *const cpi,
                              const MB_MODE_INFO *const mi, int mi_row,
                              int mi_col, BLOCK_SIZE bsize) {
  if (mi->ref_frame[0] != LAST_FRAME || !is_inter_block(mi) ||
      mi->segment_id > CR_SEGMENT_ID_BOOST2) {
    return;
  }
  const AV1_COMMON *const cm = &cpi->common;
  const MV mv = mi->mv[0].as_mv;
  const int bw = mi_size_wide[bsize] >> 1;
  const int bh = mi_size_high[bsize] >> 1;
  const int xmis = AOMMIN((cm->mi_params.mi_cols - mi_col) >> 1, bw);
  const int ymis = AOMMIN((cm->mi_params.mi_rows - mi_row) >> 1, bh);
  const int block_index =
      (mi_row >> 1) * (cm->mi_params.mi_cols >> 1) + (mi_col >> 1);
  for (int y = 0; y < ymis; y++) {
    for (int x = 0; x < xmis; x++) {
      // consec_zero_mv is in the scale of 8x8 blocks
      const int map_offset = block_index + y * (cm->mi_params.mi_cols >> 1) + x;
      if (abs(mv.row) < 10 && abs(mv.col) < 10) {
        if (cpi->consec_zero_mv[map_offset] < 255)
          cpi->consec_zero_mv[map_offset]++;
      } else {
        cpi->consec_zero_mv[map_offset] = 0;
      }
    }
  }
}